

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

reference __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::at(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
     *this,size_type idx)

{
  reference pvVar1;
  type_error *__return_storage_ptr__;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator local_40 [32];
  
  if (this->m_type == array) {
    pvVar1 = std::
             vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             ::at((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   *)(this->m_value).object,idx);
    return pvVar1;
  }
  __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
  pcVar2 = type_name(this);
  std::__cxx11::string::string((string *)&local_80,pcVar2,local_40);
  std::operator+(&local_60,"cannot use at() with ",&local_80);
  detail::type_error::create(__return_storage_ptr__,0x130,&local_60);
  __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::exception::~exception);
}

Assistant:

reference at(size_type idx) {
		// at only works for arrays
		if (JSON_LIKELY(is_array())) {
			JSON_TRY { return m_value.array->at(idx); }
			JSON_CATCH(std::out_of_range&) {
				// create better exception explanation
				JSON_THROW(out_of_range::create(401, "array index " + std::to_string(idx) + " is out of range"));
			}
		}